

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O3

void bsp_qsize(bsp_size_t *nmessages,bsp_size_t *accum_nbytes)

{
  ulong uVar1;
  
  if ((s_spmd == (Spmd *)0x0) || (s_spmd->m_closed == true)) {
    bsp_abort("bsp_qsize: can only be called within SPMD section\n");
  }
  if (nmessages == (bsp_size_t *)0x0 || accum_nbytes == (bsp_size_t *)0x0) {
    bsp_abort("bsp_qsize: both arguments may not be NULL\n");
  }
  if ((s_bsmp->m_total_n_messages & 0xffffffff80000000) != 0) {
    bsp_abort("bsp_qsize: Integer overflow while querying number of messages in queue. There are %zu messages while the data type allows only %zu\n"
              ,s_bsmp->m_total_n_messages,0x7fffffff);
  }
  uVar1 = s_bsmp->m_total_payload;
  if ((uVar1 & 0xffffffff80000000) != 0) {
    bsp_abort("bsp_qsize: Integer overflow while querying total amount of payload in queue. The total payload size is %zu  while the data type allows only %zu\n"
              ,uVar1,0x7fffffff);
    uVar1 = s_bsmp->m_total_payload;
  }
  *nmessages = (bsp_size_t)s_bsmp->m_total_n_messages;
  *accum_nbytes = (bsp_size_t)uVar1;
  return;
}

Assistant:

void bsp_qsize( bsp_size_t * nmessages, bsp_size_t * accum_nbytes )
{
    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_qsize: can only be called within SPMD section\n");

    if ( nmessages == NULL || accum_nbytes == NULL )
        bsp_abort("bsp_qsize: both arguments may not be NULL\n");

    size_t bsp_size_max = std::numeric_limits<bsp_size_t>::max();
    if ( s_bsmp->n_total_messages() > bsp_size_max )
        bsp_abort("bsp_qsize: Integer overflow while querying number of "
                "messages in queue. There are %zu messages while the data"
                " type allows only %zu\n", s_bsmp->n_total_messages(),
                bsp_size_max );

   if ( s_bsmp->total_payload() > bsp_size_max )
        bsp_abort("bsp_qsize: Integer overflow while querying total amount of "
                "payload in queue. The total payload size is %zu  while the data"
                " type allows only %zu\n", s_bsmp->total_payload(),
                bsp_size_max );

   * nmessages = static_cast<bsp_size_t>( s_bsmp->n_total_messages() );
   * accum_nbytes = static_cast<bsp_size_t>( s_bsmp->total_payload() );
}